

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::Error(char *m1,char *m2,char *m3,char *m4)

{
  char *m1_00;
  allocator local_49;
  string local_48 [8];
  string message;
  char *m4_local;
  char *m3_local;
  char *m2_local;
  char *m1_local;
  
  message.field_2._8_8_ = m4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"CMake Error: ",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (m1 != (char *)0x0) {
    std::__cxx11::string::operator+=(local_48,m1);
  }
  if (m2 != (char *)0x0) {
    std::__cxx11::string::operator+=(local_48,m2);
  }
  if (m3 != (char *)0x0) {
    std::__cxx11::string::operator+=(local_48,m3);
  }
  if (message.field_2._8_8_ != 0) {
    std::__cxx11::string::operator+=(local_48,(char *)message.field_2._8_8_);
  }
  s_ErrorOccured = true;
  m1_00 = (char *)std::__cxx11::string::c_str();
  Message(m1_00,"Error");
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmSystemTools::Error(const char* m1, const char* m2, const char* m3,
                          const char* m4)
{
  std::string message = "CMake Error: ";
  if (m1) {
    message += m1;
  }
  if (m2) {
    message += m2;
  }
  if (m3) {
    message += m3;
  }
  if (m4) {
    message += m4;
  }
  cmSystemTools::s_ErrorOccured = true;
  cmSystemTools::Message(message.c_str(), "Error");
}